

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

int_fast32_t absl::time_internal::cctz::anon_unknown_0::Decode32(char *cp)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  for (lVar1 = 0; (int)lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar3 = uVar3 << 8 | (ulong)(byte)cp[lVar1];
  }
  uVar2 = uVar3 - 0x100000000;
  if ((uVar3 & 0xffffffff80000000) == 0) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

std::int_fast32_t Decode32(const char* cp) {
  std::uint_fast32_t v = 0;
  for (int i = 0; i != (32 / 8); ++i) v = (v << 8) | Decode8(cp++);
  const std::int_fast32_t s32max = 0x7fffffff;
  const auto s32maxU = static_cast<std::uint_fast32_t>(s32max);
  if (v <= s32maxU) return static_cast<std::int_fast32_t>(v);
  return static_cast<std::int_fast32_t>(v - s32maxU - 1) - s32max - 1;
}